

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O3

void interpolatetest(void)

{
  double local_88 [13];
  double ylo;
  double yhi;
  
  local_88[0] = -4.38;
  local_88[1] = -4.15;
  local_88[2] = -4.04;
  local_88[3] = -3.99;
  local_88[4] = -3.98;
  local_88[5] = -3.96;
  local_88[6] = 25.0;
  local_88[7] = 50.0;
  local_88[8] = 100.0;
  local_88[9] = 250.0;
  local_88[10] = 500.0;
  local_88[0xb] = 100000.0;
  arrayminmax(local_88,6,local_88 + 0xc,&ylo);
  interpolate_linear(local_88 + 6,local_88,6,2000.0);
  printf("OUT %g \n");
  return;
}

Assistant:

void interpolatetest() {
	int N;
	double ylo,yhi,val,out;

	double tablei[6] = { -4.38, -4.15, -4.04, -3.99, -3.98, -3.96};
	double tablet[6] = {25, 50, 100, 250, 500, 100000};

	val = 2000;
	N = 6;

	arrayminmax(tablei,N,&ylo,&yhi);


	out = interpolate_linear(tablet,tablei,N,val);

	printf("OUT %g \n",out);


}